

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall tf::Executor::_schedule(Executor *this,Worker *worker,Node *node)

{
  size_type sVar1;
  vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
  *this_00;
  scoped_lock<std::mutex> *in_RDX;
  UnboundedTaskQueue<tf::Node_*> *this_01;
  long in_RSI;
  long in_RDI;
  scoped_lock<std::mutex> lock;
  unsigned_long b;
  mutex_type *in_stack_ffffffffffffff88;
  anon_class_16_2_3fe397bd *in_stack_ffffffffffffffd8;
  Node *in_stack_ffffffffffffffe0;
  BoundedTaskQueue<tf::Node_*,_8UL> *in_stack_ffffffffffffffe8;
  
  if (*(long *)(in_RSI + 0x18) == in_RDI) {
    BoundedTaskQueue<tf::Node*,8ul>::
    push<tf::Node*&,tf::Executor::_schedule(tf::Worker&,tf::Node*)::_lambda()_1_>
              (in_stack_ffffffffffffffe8,(Node **)in_stack_ffffffffffffffe0,
               in_stack_ffffffffffffffd8);
    NonblockingNotifierV2::notify_one((NonblockingNotifierV2 *)0x16ec25);
  }
  else {
    this_00 = (vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
               *)(in_RDI + 0xd8);
    sVar1 = std::
            vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
            ::size(this_00);
    this_01 = (UnboundedTaskQueue<tf::Node_*> *)((ulong)in_RDX % sVar1);
    std::vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
    ::operator[](this_00,(size_type)this_01);
    std::scoped_lock<std::mutex>::scoped_lock(in_RDX,in_stack_ffffffffffffff88);
    std::vector<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
    ::operator[](this_00,(size_type)this_01);
    UnboundedTaskQueue<tf::Node_*>::push(this_01,in_stack_ffffffffffffffe0);
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x16ecda);
    NonblockingNotifierV2::notify_one((NonblockingNotifierV2 *)0x16ece8);
  }
  return;
}

Assistant:

inline void Executor::_schedule(Worker& worker, Node* node) {
  
  // caller is a worker to this pool - starting at v3.5 we do not use
  // any complicated notification mechanism as the experimental result
  // has shown no significant advantage.
  if(worker._executor == this) {
    worker._wsq.push(node, [&](){ _buffers.push(node); });
    _notifier.notify_one();
    return;
  }
  
  // go through the centralized queue
  _buffers.push(node);
  _notifier.notify_one();
}